

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Matchers::StdString::ContainsMatcher>
::MatchExpr(MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Matchers::StdString::ContainsMatcher>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
           ContainsMatcher *matcher,StringRef *matcherString)

{
  int iVar1;
  StringRef *matcherString_local;
  ContainsMatcher *matcher_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local;
  MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Matchers::StdString::ContainsMatcher>
  *this_local;
  
  iVar1 = (*(matcher->super_StringMatcherBase).
            super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_MatcherUntypedBase._vptr_MatcherUntypedBase[3])(matcher,arg);
  ITransientExpression::ITransientExpression(&this->super_ITransientExpression,true,SUB41(iVar1,0));
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_003d72b0;
  this->m_arg = arg;
  Matchers::StdString::ContainsMatcher::ContainsMatcher(&this->m_matcher,matcher);
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = matcherString->m_size;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}